

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::parse_superclass_list(CTcParser *this,CTcSymObj *obj_sym,CTPNSuperclassList *sclist)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  tc_symtype_t tVar3;
  int iVar4;
  CTcToken *this_00;
  CTcSymObjBase *this_01;
  size_t sVar5;
  char *pcVar6;
  CTPNSuperclass *in_RDX;
  CTcSymObjBase *in_RSI;
  CTcParser *in_RDI;
  CTcSymObj *sc_sym;
  CTcToken *tok;
  int done;
  CTcSymObjBase *in_stack_ffffffffffffff58;
  CTcTokenizer *in_stack_ffffffffffffff60;
  CTcTokenizer *in_stack_ffffffffffffff68;
  CTPNSuperclass *in_stack_ffffffffffffff70;
  CTcSymObjBase *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  CTcSymObjBase *in_stack_ffffffffffffff90;
  
  bVar1 = false;
  while (!bVar1) {
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x26ac6c);
    if (tVar2 == TOKT_SYM) {
      this_00 = CTcTokenizer::getcur(G_tok);
      get_global_symtab(in_RDI);
      CTcToken::get_text(this_00);
      CTcToken::get_text_len(this_00);
      this_01 = (CTcSymObjBase *)
                CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_ffffffffffffff60,
                                   (textchar_t *)in_stack_ffffffffffffff58,0x26ace2);
      if ((((this_01 == (CTcSymObjBase *)0x0) || (in_RSI == (CTcSymObjBase *)0x0)) ||
          (tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01), tVar3 != TC_SYM_OBJ)) ||
         ((this_01 != in_RSI &&
          (iVar4 = CTcSymObjBase::has_superclass
                             (in_stack_ffffffffffffff78,(CTcSymObj *)in_stack_ffffffffffffff70),
          iVar4 == 0)))) {
        in_stack_ffffffffffffff70 = in_RDX;
        in_stack_ffffffffffffff78 = (CTcSymObjBase *)CTcPrsAllocObj::operator_new(0x26adae);
        pcVar6 = CTcToken::get_text(this_00);
        in_stack_ffffffffffffff68 = (CTcTokenizer *)CTcToken::get_text_len(this_00);
        CTPNSuperclass::CTPNSuperclass
                  (in_stack_ffffffffffffff70,(textchar_t *)in_stack_ffffffffffffff68,
                   (size_t)in_stack_ffffffffffffff60);
        CTPNSuperclassList::append
                  ((CTPNSuperclassList *)in_stack_ffffffffffffff70,
                   (CTPNSuperclass *)in_stack_ffffffffffffff78);
        if (in_RSI != (CTcSymObjBase *)0x0) {
          in_stack_ffffffffffffff58 = in_RSI;
          in_stack_ffffffffffffff60 = (CTcTokenizer *)CTcToken::get_text(this_00);
          CTcToken::get_text_len(this_00);
          CTcSymObjBase::add_sc_name_entry
                    (in_stack_ffffffffffffff90,
                     (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (size_t)pcVar6);
        }
      }
      else {
        sVar5 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x26ad45);
        in_stack_ffffffffffffff8c = (uint)sVar5;
        in_stack_ffffffffffffff90 =
             (CTcSymObjBase *)CTcSymbolBase::get_sym((CTcSymbolBase *)0x26ad53);
        sVar5 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x26ad65);
        pcVar6 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x26ad76);
        CTcTokenizer::log_error
                  (0x2bbb,(ulong)in_stack_ffffffffffffff8c,in_stack_ffffffffffffff90,
                   sVar5 & 0xffffffff,pcVar6);
      }
      tVar2 = CTcTokenizer::next(in_stack_ffffffffffffff68);
      if (tVar2 == TOKT_COMMA) {
        CTcTokenizer::next(in_stack_ffffffffffffff68);
      }
      else {
        bVar1 = true;
      }
    }
    else if (tVar2 == TOKT_OBJECT) {
      if ((in_RDX->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0)
      {
        CTcTokenizer::log_error(0x2b5f);
      }
      if (in_RSI != (CTcSymObjBase *)0x0) {
        CTcSymObjBase::set_sc_is_root(in_RSI,1);
      }
      CTcTokenizer::next(in_stack_ffffffffffffff68);
      bVar1 = true;
    }
    else {
      CTcTokenizer::log_error_curtok
                (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      bVar1 = true;
    }
  }
  return;
}

Assistant:

void CTcParser::parse_superclass_list(
    CTcSymObj *obj_sym, CTPNSuperclassList &sclist)
{
    /* scan the list */
    for (int done = FALSE ; !done ; )
    {
        /* we need a symbol */
        switch(G_tok->cur())
        {
        case TOKT_SYM:
            /* a symbol must be a superclass name - look it up */
            {
                const CTcToken *tok = G_tok->getcur();
                CTcSymObj *sc_sym = (CTcSymObj *)get_global_symtab()->find(
                    tok->get_text(), tok->get_text_len());

                /* 
                 *   If this symbol is defined, and it's an object, check to
                 *   make sure this won't set up a circular class definition
                 *   - so, make sure the base class isn't the same as the
                 *   object being defined, and that it doesn't inherit from
                 *   the object being defined.  
                 */
                if (sc_sym != 0
                    && obj_sym != 0
                    && sc_sym->get_type() == TC_SYM_OBJ
                    && (sc_sym == obj_sym || sc_sym->has_superclass(obj_sym)))
                {
                    /* 
                     *   this is a circular class definition - complain about
                     *   it and don't add it to my superclass list 
                     */
                    G_tok->log_error(TCERR_CIRCULAR_CLASS_DEF,
                                     (int)sc_sym->get_sym_len(),
                                     sc_sym->get_sym(),
                                     (int)obj_sym->get_sym_len(),
                                     obj_sym->get_sym());
                }
                else
                {
                    /* it's good - add the new superclass to our list */
                    sclist.append(new CTPNSuperclass(
                        tok->get_text(), tok->get_text_len()));
                    
                    /* 
                     *   add it to the symbol's superclass name list as well
                     *   - we use this for keeping track of the hierarchy in
                     *   the symbol file for compile-time access 
                     */
                    if (obj_sym != 0)
                        obj_sym->add_sc_name_entry(
                            tok->get_text(), tok->get_text_len());
                }
                
                /* skip the symbol and see what follows */
                switch (G_tok->next())
                {
                case TOKT_COMMA:
                    /* we have another superclass following */
                    G_tok->next();
                    break;
                    
                default:
                    /* no more superclasses */
                    done = TRUE;
                    break;
                }
            }
            break;

        case TOKT_OBJECT:
            /* 
             *   it's a basic object definition - make sure other
             *   superclasses weren't specified 
             */
            if (sclist.head_ != 0)
                G_tok->log_error(TCERR_OBJDEF_OBJ_NO_SC);
            
            /* 
             *   mark the object as having an explicit superclass of the root
             *   object class 
             */
            if (obj_sym != 0)
                obj_sym->set_sc_is_root(TRUE);
            
            /* 
             *   skip the 'object' keyword and we're done - there's no
             *   superclass list 
             */
            G_tok->next();
            done = TRUE;
            break;
            
        default:
            /* premature end of the object list */
            G_tok->log_error_curtok(TCERR_OBJDEF_REQ_SC);
            
            /* stop here */
            done = TRUE;
            break;
        }
    }
}